

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

axbStatus_t initMatSparseRandom(axbMat_s *A,size_t nonzeros_per_row)

{
  size_t sVar1;
  void *__ptr;
  axbStatus_t aVar2;
  int iVar3;
  undefined4 *puVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  size_t rows;
  undefined4 *local_80;
  axbStatus_t local_74;
  void *local_70;
  void *local_68;
  size_t local_60;
  axbMat_s *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  size_t cols;
  
  aVar2 = axbMatGetSizes(A,&rows,&cols);
  if (aVar2 == 0) {
    sVar10 = rows * nonzeros_per_row;
    local_74 = aVar2;
    local_58 = A;
    printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n",rows
           ,sVar10);
    sVar1 = rows;
    puVar4 = (undefined4 *)malloc(rows * 4 + 4);
    local_68 = malloc(sVar10 * 4);
    local_60 = sVar10;
    local_70 = malloc(sVar10 * 8);
    *puVar4 = 0;
    local_80 = puVar4;
    if (rows != 0) {
      uVar9 = sVar1 / nonzeros_per_row >> 1;
      uVar5 = 0;
      lVar11 = 0;
      do {
        local_40 = uVar5 >> 1;
        lVar12 = (long)(int)lVar11;
        lVar7 = 0;
        iVar8 = 0;
        local_50 = lVar11;
        local_48 = uVar5;
        do {
          iVar6 = iVar8 * (int)uVar9 + (int)local_40;
          iVar3 = rand();
          *(int *)((long)local_68 + lVar12 * 4) = (int)((ulong)(long)iVar3 % uVar9) + iVar6;
          iVar3 = rand();
          *(double *)((long)local_70 + lVar12 * 8) = (double)(iVar3 % 0x3ff + -500) / 300.0 + 1.0;
          lVar12 = lVar12 + 1;
          iVar8 = iVar8 + 1;
          lVar7 = lVar7 + -1;
        } while (-(ulong)(nonzeros_per_row == 0) - nonzeros_per_row != lVar7);
        local_80[local_48 + 1] = (int)local_50 - (int)lVar7;
        uVar5 = local_48 + 1;
        lVar11 = lVar12;
      } while (uVar5 < rows);
    }
    __ptr = local_68;
    aVar2 = axbMatSetValuesCSR(local_58,local_80,AXB_INT_32,local_68,AXB_INT_32,local_70,
                               AXB_REAL_DOUBLE,local_60);
    if (aVar2 == 0) {
      free(local_80);
      free(__ptr);
      free(local_70);
      aVar2 = 0;
    }
    else {
      initMatSparseRandom_cold_2();
    }
  }
  else {
    initMatSparseRandom_cold_1();
  }
  return aVar2;
}

Assistant:

axbStatus_t initMatSparseRandom(struct axbMat_s *A, size_t nonzeros_per_row)
{
  size_t rows, cols;
  AXB_ERR_CHECK(axbMatGetSizes(A, &rows, &cols));
  size_t nonzeros = rows * nonzeros_per_row;

  printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n", rows, nonzeros);

  int    *host_rows = malloc(sizeof(int)   *(rows+1));
  int    *host_cols = malloc(sizeof(int)   *(nonzeros));
  double *host_vals = malloc(sizeof(double)*(nonzeros));

  // populate
  host_rows[0] = 0;
  int nnz_index = 0;
  size_t col_inc = rows / nonzeros_per_row / 2;
  for (size_t i=0; i<rows; ++i) {
    for (size_t j=0; j<nonzeros_per_row; ++j) {
      host_cols[nnz_index] = i/2 + col_inc * j + rand() % col_inc;
      host_vals[nnz_index] = 1.0 + (rand() % 1023 - 500.0) / 300.0;
      ++nnz_index;
    }
    host_rows[i+1] = nnz_index;
  }

  // copy over to matrix:
  AXB_ERR_CHECK(axbMatSetValuesCSR(A, host_rows, AXB_INT_32, host_cols, AXB_INT_32, host_vals, AXB_REAL_DOUBLE, nonzeros));

  free(host_rows);
  free(host_cols);
  free(host_vals);
  return 0;
}